

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileBuffer.cpp
# Opt level: O2

int __thiscall FileBuffer::getBufferPosition(FileBuffer *this,int position)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  uint segment;
  int iVar4;
  uint loadToPosition;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int loadToPosition_00;
  ulong uVar8;
  int loadToPosition_01;
  ulong uVar9;
  
  iVar1 = this->_fileSegmentLength;
  segment = position / iVar1;
  piVar3 = this->_loadedSegments;
  uVar7 = 0;
  uVar6 = (ulong)(uint)this->_segments;
  if (this->_segments < 1) {
    uVar6 = uVar7;
  }
  iVar4 = position % iVar1 - iVar1;
  uVar5 = 0xffffffffffffffff;
  uVar8 = 0xffffffff;
  uVar9 = 0xffffffff;
  while( true ) {
    loadToPosition_01 = (int)uVar9;
    loadToPosition_00 = (int)uVar8;
    loadToPosition = (uint)uVar5;
    if (uVar6 == uVar7) break;
    uVar2 = piVar3[uVar7];
    if ((uVar2 & loadToPosition) == 0xffffffff) {
      uVar5 = uVar7;
    }
    uVar5 = uVar5 & 0xffffffff;
    if ((loadToPosition_00 == -1) || ((int)uVar2 < piVar3[loadToPosition_00])) {
      uVar8 = uVar7 & 0xffffffff;
    }
    if ((loadToPosition_01 == -1) || (piVar3[loadToPosition_01] < (int)uVar2)) {
      uVar9 = uVar7 & 0xffffffff;
    }
    uVar7 = uVar7 + 1;
    iVar4 = iVar4 + iVar1;
    if (uVar2 == segment) {
      return iVar4;
    }
  }
  if (loadToPosition != 0xffffffff) {
    loadSegment(this,segment,loadToPosition);
    return position % this->_fileSegmentLength + loadToPosition * this->_fileSegmentLength;
  }
  if (piVar3[loadToPosition_01] < (int)segment) {
    loadSegment(this,segment,loadToPosition_00);
    return position % this->_fileSegmentLength + loadToPosition_00 * this->_fileSegmentLength;
  }
  if ((int)segment < piVar3[loadToPosition_00]) {
    loadSegment(this,segment,loadToPosition_01);
    return position % this->_fileSegmentLength + loadToPosition_01 * this->_fileSegmentLength;
  }
  puts(
      "Unexpected Error! No segment slot found to overwrite! This should never happen. Maybe zero or negative segment count?"
      );
  return -1;
}

Assistant:

int FileBuffer::getBufferPosition(int position) {
    int segment = getSegmentNumber(position);

    int firstFreeSegment = -1;
    int lowestSegment = -1;
    int highestSegment = -1;

    for (int i = 0; i < _segments; i++) {
        // get first free segment
        if (_loadedSegments[i] == -1 && firstFreeSegment == -1) {
            firstFreeSegment = i;
        }

        // get lowest segment
        if (lowestSegment == -1 || _loadedSegments[i] < _loadedSegments[lowestSegment]) {
            lowestSegment = i;
        }

        // get highest segment
        if (highestSegment == -1 || _loadedSegments[i] > _loadedSegments[highestSegment]) {
            highestSegment = i;
        }

        // Segment already loaded, so just take it
        if (_loadedSegments[i] == segment) {
            return (i * _fileSegmentLength) + (position % _fileSegmentLength);
        }
    }

    //Segment not yet loaded:

    // take a free segment slot, if one is found
    if (firstFreeSegment != -1) {
        loadSegment(segment, firstFreeSegment);
        return (firstFreeSegment * _fileSegmentLength) + (position % _fileSegmentLength);
    }

    // overwrite the lowest segment slot, if segment number is higher than all loaded segments
    if (segment > _loadedSegments[highestSegment]) {
        loadSegment(segment, lowestSegment);
        return (lowestSegment * _fileSegmentLength) + (position % _fileSegmentLength);
    }

    // overwrite the highest segment slot, if segment number is lower than all loaded segments
    if (segment < _loadedSegments[lowestSegment]) {
        loadSegment(segment, highestSegment);
        return (highestSegment * _fileSegmentLength) + (position % _fileSegmentLength);
    }

    printf("Unexpected Error! No segment slot found to overwrite! This should never happen. Maybe zero or negative segment count?\n");
    return -1;
}